

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomGradientStop::read(DomGradientStop *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  char cVar2;
  int iVar3;
  DomColor *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar4 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar4 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x10);
      if ((local_68.m_size == 8) &&
         (QVar5.m_data = local_68.m_data, QVar5.m_size = 8, QVar6.m_data = L"position",
         QVar6.m_size = 8, cVar2 = QtPrivate::equalStrings(QVar5,QVar6), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_position = dVar1;
        this->m_has_attr_position = true;
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar4 = lVar4 + 0x68;
    } while (local_50.size * 0x68 - lVar4 != 0);
  }
  iVar3 = QXmlStreamReader::error();
  if (iVar3 == 0) {
    do {
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar7.m_data = L"color";
        QVar7.m_size = 5;
        __nbytes_00 = L"color";
        iVar3 = QtPrivate::compareStrings(local_68,QVar7,CaseInsensitive);
        if (iVar3 == 0) {
          this_00 = (DomColor *)operator_new(0x18);
          this_00->m_attr_alpha = 0;
          this_00->m_has_attr_alpha = false;
          *(undefined3 *)&this_00->field_0x5 = 0;
          this_00->m_children = 0;
          this_00->m_red = 0;
          this_00->m_green = 0;
          this_00->m_blue = 0;
          DomColor::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          if (this->m_color != (DomColor *)0x0) {
            operator_delete(this->m_color,0x18);
          }
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_color = this_00;
        }
        else {
          local_98.a.m_size = 0x13;
          local_98.a.m_data = "Unexpected element ";
          local_98.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_80,&local_98);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar3 == 5) break;
      iVar3 = QXmlStreamReader::error();
    } while (iVar3 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradientStop::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"position"_s) {
            setAttributePosition(attribute.value().toDouble());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}